

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptPromise.cpp
# Opt level: O2

void __thiscall
Js::JavascriptPromise::MarkVisitKindSpecificPtrs
          (JavascriptPromise *this,SnapshotExtractor *extractor)

{
  Var var;
  JavascriptPromiseReaction *this_00;
  code *pcVar1;
  SListBase<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount> *pSVar2;
  bool bVar3;
  undefined4 *puVar4;
  Type *pTVar5;
  SList<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount> *pSVar6;
  SListNodeBase<Memory::Recycler> local_48;
  Iterator local_40;
  
  var = (this->result).ptr;
  if (var != (Var)0x0) {
    TTD::SnapshotExtractor::MarkVisitVar(extractor,var);
  }
  pSVar6 = (this->reactions).ptr;
  if (pSVar6 != (SList<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount> *)0x0) {
    local_40.list =
         &pSVar6->super_SListBase<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount>;
    local_40.current = (NodeBase *)pSVar6;
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    while( true ) {
      if (pSVar6 == (SList<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount> *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar4 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                                    ,0x76,"(current != nullptr)","current != nullptr");
        if (!bVar3) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar4 = 0;
      }
      pSVar2 = local_40.list;
      SListNodeBase<Memory::Recycler>::Next(&local_48);
      if (local_48.next.ptr == (Type)pSVar2) break;
      SListNodeBase<Memory::Recycler>::Next(&local_48);
      local_40.current = (NodeBase *)local_48.next.ptr;
      pTVar5 = SListBase<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount>::Iterator::
               Data(&local_40);
      this_00 = pTVar5->resolveReaction;
      JavascriptPromiseReaction::MarkVisitPtrs(pTVar5->rejectReaction,extractor);
      JavascriptPromiseReaction::MarkVisitPtrs(this_00,extractor);
      pSVar6 = (SList<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount> *)
               local_40.current;
    }
  }
  return;
}

Assistant:

void JavascriptPromise::MarkVisitKindSpecificPtrs(TTD::SnapshotExtractor* extractor)
    {
        if(this->result != nullptr)
        {
            extractor->MarkVisitVar(this->result);
        }

        if(this->reactions != nullptr)
        {
            this->reactions->Map([&](JavascriptPromiseReactionPair pair) {
                pair.rejectReaction->MarkVisitPtrs(extractor);
                pair.resolveReaction->MarkVisitPtrs(extractor);
            });
        }
    }